

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_formparse.c
# Opt level: O3

tool_mime *
tool_mime_new_filedata(tool_mime *parent,char *filename,_Bool isremotefile,CURLcode *errcode)

{
  int iVar1;
  ParameterError PVar2;
  char *__ptr;
  tool_mime *ptVar3;
  long lVar4;
  curl_off_t cVar5;
  size_t uznum;
  size_t stdinsize;
  stat sbuf;
  char *local_d8;
  undefined8 local_d0;
  size_t local_c8;
  stat64 local_c0;
  
  *errcode = CURLE_OUT_OF_MEMORY;
  if ((*filename == '-') && (filename[1] == '\0')) {
    iVar1 = fileno(_stdin);
    local_d8 = (char *)0x0;
    lVar4 = ftell(_stdin);
    if (((lVar4 < 0 || iVar1 < 0) || (iVar1 = fstat64(iVar1,&local_c0), iVar1 != 0)) ||
       ((local_c0.st_mode & 0xf000) != 0x8000)) {
      local_c8 = 0;
      PVar2 = file2memory(&local_d8,&local_c8,(FILE *)_stdin);
      if (PVar2 != PARAM_OK) goto LAB_0010e18c;
      iVar1 = ferror(_stdin);
      if (iVar1 == 0) {
        local_d0 = 0;
        uznum = local_c8;
        if (local_c8 == 0) {
          local_d8 = strdup("");
          if (local_d8 == (char *)0x0) goto LAB_0010e18c;
          uznum = 0;
          local_d0 = 0;
        }
      }
      else {
        free(local_d8);
        local_d8 = (char *)0x0;
        local_d0 = 0x1a;
        uznum = local_c8;
      }
      cVar5 = curlx_uztoso(uznum);
      lVar4 = 0;
    }
    else {
      local_d0 = 0;
      cVar5 = local_c0.st_size - lVar4;
      if (local_c0.st_size - lVar4 < 1) {
        cVar5 = 0;
      }
    }
    ptVar3 = (tool_mime *)calloc(1,0x70);
    if (ptVar3 == (tool_mime *)0x0) {
      free(local_d8);
    }
    else {
      ptVar3->kind = TOOLMIME_STDIN;
      ptVar3->parent = parent;
      if (parent != (tool_mime *)0x0) {
        ptVar3->prev = parent->subparts;
        parent->subparts = ptVar3;
      }
      ptVar3->data = local_d8;
      ptVar3->origin = lVar4;
      ptVar3->size = cVar5;
      if (!isremotefile) {
        ptVar3->kind = TOOLMIME_STDINDATA;
      }
      *errcode = (CURLcode)local_d0;
    }
  }
  else {
    __ptr = strdup(filename);
    if (__ptr != (char *)0x0) {
      ptVar3 = (tool_mime *)calloc(1,0x70);
      if (ptVar3 != (tool_mime *)0x0) {
        ptVar3->kind = TOOLMIME_FILE;
        ptVar3->parent = parent;
        if (parent != (tool_mime *)0x0) {
          ptVar3->prev = parent->subparts;
          parent->subparts = ptVar3;
        }
        ptVar3->data = __ptr;
        if (!isremotefile) {
          ptVar3->kind = TOOLMIME_FILEDATA;
        }
        *errcode = CURLE_OK;
        return ptVar3;
      }
      free(__ptr);
    }
LAB_0010e18c:
    ptVar3 = (tool_mime *)0x0;
  }
  return ptVar3;
}

Assistant:

static struct tool_mime *tool_mime_new_filedata(struct tool_mime *parent,
                                                const char *filename,
                                                bool isremotefile,
                                                CURLcode *errcode)
{
  CURLcode result = CURLE_OK;
  struct tool_mime *m = NULL;

  *errcode = CURLE_OUT_OF_MEMORY;
  if(strcmp(filename, "-")) {
    /* This is a normal file. */
    filename = strdup(filename);
    if(filename) {
      m = tool_mime_new(parent, TOOLMIME_FILE);
      if(!m)
        CONST_FREE(filename);
      else {
        m->data = filename;
        if(!isremotefile)
          m->kind = TOOLMIME_FILEDATA;
       *errcode = CURLE_OK;
      }
    }
  }
  else {        /* Standard input. */
    int fd = fileno(stdin);
    char *data = NULL;
    curl_off_t size;
    curl_off_t origin;
    struct_stat sbuf;

    set_binmode(stdin);
    origin = ftell(stdin);
    /* If stdin is a regular file, do not buffer data but read it
       when needed. */
    if(fd >= 0 && origin >= 0 && !fstat(fd, &sbuf) &&
#ifdef __VMS
       sbuf.st_fab_rfm != FAB$C_VAR && sbuf.st_fab_rfm != FAB$C_VFC &&
#endif
       S_ISREG(sbuf.st_mode)) {
      size = sbuf.st_size - origin;
      if(size < 0)
        size = 0;
    }
    else {  /* Not suitable for direct use, buffer stdin data. */
      size_t stdinsize = 0;

      if(file2memory(&data, &stdinsize, stdin) != PARAM_OK) {
        /* Out of memory. */
        return m;
      }

      if(ferror(stdin)) {
        result = CURLE_READ_ERROR;
        Curl_safefree(data);
        data = NULL;
      }
      else if(!stdinsize) {
        /* Zero-length data has been freed. Re-create it. */
        data = strdup("");
        if(!data)
          return m;
      }
      size = curlx_uztoso(stdinsize);
      origin = 0;
    }
    m = tool_mime_new(parent, TOOLMIME_STDIN);
    if(!m)
      Curl_safefree(data);
    else {
      m->data = data;
      m->origin = origin;
      m->size = size;
      m->curpos = 0;
      if(!isremotefile)
        m->kind = TOOLMIME_STDINDATA;
      *errcode = result;
    }
  }
  return m;
}